

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O1

fromBase64_helper_result
anon_unknown.dwarf_bea423::fromBase64_helper
          (char *input,qsizetype inputSize,char *output,Base64Options options)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  fromBase64_helper_result fVar11;
  undefined4 local_40;
  
  if (inputSize < 1) {
    lVar3 = 0;
    local_40 = 0;
  }
  else {
    local_40 = 0;
    uVar5 = 0;
    iVar4 = 0;
    lVar3 = 0;
    lVar8 = 0;
    do {
      bVar1 = input[lVar8];
      iVar6 = (int)(char)bVar1;
      if ((byte)(bVar1 + 0xbf) < 0x1a) {
        uVar7 = iVar6 - 0x41;
LAB_0030a1b0:
        bVar10 = true;
        lVar9 = lVar8;
        if (uVar7 != 0xffffffff) {
          uVar5 = uVar7 | uVar5 << 6;
          if (iVar4 < 2) {
            iVar4 = iVar4 + 6;
          }
          else {
            iVar4 = iVar4 + -2;
            output[lVar3] = (char)(uVar5 >> ((byte)iVar4 & 0x1f));
            lVar3 = lVar3 + 1;
            uVar5 = ~(-1 << ((byte)iVar4 & 0x1f)) & uVar5;
          }
        }
      }
      else {
        if ((byte)(bVar1 + 0x9f) < 0x1a) {
          uVar7 = iVar6 - 0x47;
          goto LAB_0030a1b0;
        }
        if ((byte)(bVar1 - 0x30) < 10) {
          uVar7 = iVar6 + 4;
          goto LAB_0030a1b0;
        }
        if (0x2e < bVar1) {
          if (bVar1 == 0x2f) {
            bVar10 = ((uint)options.super_QFlagsStorageHelper<QByteArray::Base64Option,_4>.
                            super_QFlagsStorage<QByteArray::Base64Option>.i & 1) == 0;
            if (((uint)options.super_QFlagsStorageHelper<QByteArray::Base64Option,_4>.
                       super_QFlagsStorage<QByteArray::Base64Option>.i & 4) != 0 && !bVar10)
            goto LAB_0030a2d8;
            uVar7 = bVar10 - 1 | 0x3f;
          }
          else {
            if (bVar1 != 0x5f) goto LAB_0030a259;
            uVar7 = -(uint)(((uint)options.super_QFlagsStorageHelper<QByteArray::Base64Option,_4>.
                                   super_QFlagsStorage<QByteArray::Base64Option>.i & 1) == 0) | 0x3f
            ;
            if (((uint)options.super_QFlagsStorageHelper<QByteArray::Base64Option,_4>.
                       super_QFlagsStorage<QByteArray::Base64Option>.i & 5) == 4) goto LAB_0030a2d8;
          }
          goto LAB_0030a1b0;
        }
        if (((bVar1 == 0x2b) &&
            (uVar7 = 0x3e,
            ((uint)options.super_QFlagsStorageHelper<QByteArray::Base64Option,_4>.
                   super_QFlagsStorage<QByteArray::Base64Option>.i & 1) == 0)) ||
           ((bVar1 == 0x2d &&
            (uVar7 = 0x3e,
            ((uint)options.super_QFlagsStorageHelper<QByteArray::Base64Option,_4>.
                   super_QFlagsStorage<QByteArray::Base64Option>.i & 1) != 0)))) goto LAB_0030a1b0;
LAB_0030a259:
        uVar7 = 0xffffffff;
        if (((uint)options.super_QFlagsStorageHelper<QByteArray::Base64Option,_4>.
                   super_QFlagsStorage<QByteArray::Base64Option>.i & 4) == 0) goto LAB_0030a1b0;
LAB_0030a2d8:
        lVar9 = lVar8;
        if (bVar1 == 0x3d) {
          if ((inputSize & 3U) != 0) {
            local_40 = 1;
            goto LAB_0030a2f6;
          }
          uVar7 = 0xffffffff;
          if ((lVar8 == inputSize + -1) ||
             ((lVar8 == inputSize + -2 &&
              (lVar9 = lVar8 + 1, lVar2 = lVar8 + 1, lVar8 = lVar9, input[lVar2] == '='))))
          goto LAB_0030a1b0;
          bVar10 = false;
          local_40 = 3;
        }
        else {
          local_40 = 2;
LAB_0030a2f6:
          bVar10 = false;
        }
      }
      if (!bVar10) {
        lVar3 = 0;
        break;
      }
      lVar8 = lVar9 + 1;
    } while (lVar8 < inputSize);
  }
  fVar11.status = local_40;
  fVar11.decodedLength = lVar3;
  fVar11._12_4_ = 0;
  return fVar11;
}

Assistant:

fromBase64_helper_result fromBase64_helper(const char *input, qsizetype inputSize,
                                           char *output /* may alias input */,
                                           QByteArray::Base64Options options)
{
    fromBase64_helper_result result{ 0, QByteArray::Base64DecodingStatus::Ok };

    unsigned int buf = 0;
    int nbits = 0;

    qsizetype offset = 0;
    for (qsizetype i = 0; i < inputSize; ++i) {
        int ch = input[i];
        int d;

        if (ch >= 'A' && ch <= 'Z') {
            d = ch - 'A';
        } else if (ch >= 'a' && ch <= 'z') {
            d = ch - 'a' + 26;
        } else if (ch >= '0' && ch <= '9') {
            d = ch - '0' + 52;
        } else if (ch == '+' && (options & QByteArray::Base64UrlEncoding) == 0) {
            d = 62;
        } else if (ch == '-' && (options & QByteArray::Base64UrlEncoding) != 0) {
            d = 62;
        } else if (ch == '/' && (options & QByteArray::Base64UrlEncoding) == 0) {
            d = 63;
        } else if (ch == '_' && (options & QByteArray::Base64UrlEncoding) != 0) {
            d = 63;
        } else {
            if (options & QByteArray::AbortOnBase64DecodingErrors) {
                if (ch == '=') {
                    // can have 1 or 2 '=' signs, in both cases padding base64Size to
                    // a multiple of 4. Any other case is illegal.
                    if ((inputSize % 4) != 0) {
                        result.status = QByteArray::Base64DecodingStatus::IllegalInputLength;
                        return result;
                    } else if ((i == inputSize - 1) ||
                        (i == inputSize - 2 && input[++i] == '=')) {
                        d = -1; // ... and exit the loop, normally
                    } else {
                        result.status = QByteArray::Base64DecodingStatus::IllegalPadding;
                        return result;
                    }
                } else {
                    result.status = QByteArray::Base64DecodingStatus::IllegalCharacter;
                    return result;
                }
            } else {
                d = -1;
            }
        }

        if (d != -1) {
            buf = (buf << 6) | d;
            nbits += 6;
            if (nbits >= 8) {
                nbits -= 8;
                Q_ASSERT(offset < i);
                output[offset++] = buf >> nbits;
                buf &= (1 << nbits) - 1;
            }
        }
    }

    result.decodedLength = offset;
    return result;
}